

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O2

void __thiscall
mp::SolverApp<TestSolver,_TestNLReader>::Solve(SolverApp<TestSolver,_TestNLReader> *this)

{
  SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>
  *pSVar1;
  StringRef stub;
  uint banner_size;
  Result RVar2;
  Result pSVar3;
  ArrayRef<long> options;
  AppSolutionHandler<TestSolver> sol_handler;
  ArrayRef<long> local_128;
  _Vector_base<long,_std::allocator<long>_> local_f8;
  long *local_e0;
  size_t local_d8;
  AMPLS_ModelTraits local_d0;
  SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> local_98;
  
  pSVar1 = (this->handler_)._M_t.
           super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
           .
           super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_*,_false>
           ._M_head_impl;
  local_128.size_ = (size_t)pSVar1->num_options_;
  local_128.data_ = pSVar1->options_;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stub.data_ = (this->filename_no_ext)._M_dataplus._M_p;
  stub.size_ = (this->filename_no_ext)._M_string_length;
  local_128.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_128.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  banner_size = 0;
  if ((this->output_handler_).has_output == false) {
    banner_size = this->banner_size;
  }
  local_e0 = local_128.data_;
  local_d8 = local_128.size_;
  internal::AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::
  AppSolutionHandlerImpl
            ((AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *)
             &local_98,stub,&this->solver_,
             (this->builder_)._M_t.
             super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
             .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl,&local_128,
             banner_size);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&local_128);
  if ((this->callbacks_).check != (Checker_AMPLS_ModeltTraits)0x0) {
    pSVar3 = StrictMockProblemBuilder::problem
                       ((this->builder_)._M_t.
                        super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
                        .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl);
    RVar2 = MockProblemBuilder::num_vars
                      (&(pSVar3->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder);
    local_d0.n_vars = (longlong)RVar2;
    pSVar3 = StrictMockProblemBuilder::problem
                       ((this->builder_)._M_t.
                        super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
                        .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl);
    RVar2 = MockProblemBuilder::num_algebraic_cons
                      (&(pSVar3->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder);
    local_d0.n_alg_con = (longlong)RVar2;
    pSVar3 = StrictMockProblemBuilder::problem
                       ((this->builder_)._M_t.
                        super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
                        .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl);
    RVar2 = MockProblemBuilder::num_logical_cons
                      (&(pSVar3->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder);
    local_d0.n_log_con = (longlong)RVar2;
    local_d0.n_quad_con = 0;
    local_d0.n_conic_con = 0;
    (*(this->callbacks_).check)(&local_d0);
  }
  pSVar3 = StrictMockProblemBuilder::problem
                     ((this->builder_)._M_t.
                      super___uniq_ptr_impl<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_StrictMockProblemBuilder_*,_std::default_delete<StrictMockProblemBuilder>_>
                      .super__Head_base<0UL,_StrictMockProblemBuilder_*,_false>._M_head_impl);
  TestSolver::Solve(&this->solver_,pSVar3,&local_98.super_SolutionHandler);
  SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::~SolutionWriterImpl
            (&local_98);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_f8);
  return;
}

Assistant:

void SolverApp<Solver, Reader>::Solve() {
  ArrayRef<long> options(handler_->options(), handler_->num_options());
  internal::AppSolutionHandler<Solver> sol_handler(
    filename_no_ext, solver_, *builder_, options,
    output_handler_.has_output ? 0 : banner_size);

  if (GetCallbacks().check)
  {
    AMPLS_ModelTraits mt;
    mt.n_vars = builder_->problem().num_vars();
    mt.n_alg_con = builder_->problem().num_algebraic_cons();
    mt.n_log_con = builder_->problem().num_logical_cons();
    mt.n_conic_con = 0;
    mt.n_quad_con = 0;
    GetCallbacks().check(&mt);
  }
  solver_.Solve(builder_->problem(), sol_handler);
}